

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

int32_t decode_unicode_escape(char *str)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (*str != 'u') {
    __assert_fail("str[0] == \'u\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                  ,0x117,"int32_t decode_unicode_escape(const char *)");
  }
  lVar4 = 0;
  iVar3 = 0;
  do {
    cVar1 = str[lVar4 + 1];
    iVar5 = (int)cVar1;
    iVar3 = iVar3 * 0x10;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar3 = iVar3 + iVar5 + -0x30;
LAB_001193e3:
      bVar2 = true;
    }
    else {
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        iVar3 = iVar3 + iVar5 + -0x57;
        goto LAB_001193e3;
      }
      if ((byte)(cVar1 + 0xbfU) < 0x1a) {
        iVar3 = iVar3 + iVar5 + -0x37;
        goto LAB_001193e3;
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return -1;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      return iVar3;
    }
  } while( true );
}

Assistant:

static int32_t decode_unicode_escape(const char *str) {
    int i;
    int32_t value = 0;

    assert(str[0] == 'u');

    for (i = 1; i <= 4; i++) {
        char c = str[i];
        value <<= 4;
        if (l_isdigit(c))
            value += c - '0';
        else if (l_islower(c))
            value += c - 'a' + 10;
        else if (l_isupper(c))
            value += c - 'A' + 10;
        else
            return -1;
    }

    return value;
}